

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

string * __thiscall
MetaCommand::GetValueAsString
          (string *__return_storage_ptr__,MetaCommand *this,Option *option,string *fieldName)

{
  __type _Var1;
  pointer __lhs;
  string fieldname;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)fieldName);
  if (fieldName->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&local_40);
  }
  __lhs = (option->fields).
          super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl.
          super__Vector_impl_data._M_start;
  do {
    if (__lhs == (option->fields).
                 super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl
                 .super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_41);
LAB_00116985:
      std::__cxx11::string::~string((string *)&local_40);
      return __return_storage_ptr__;
    }
    _Var1 = std::operator==(&__lhs->name,&local_40);
    if (_Var1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&__lhs->value);
      goto LAB_00116985;
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

METAIO_STL::string MetaCommand::GetValueAsString(Option option,METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = option.name;
  }

  METAIO_STL::vector<Field>::const_iterator itField = option.fields.begin();
  while(itField != option.fields.end())
    {
    if((*itField).name == fieldname)
      {
      return (*itField).value;
      }
    ++itField;
    }
  return "";
}